

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageInsertDocsize(Fts5Storage *p,i64 iRowid,Fts5Buffer *pBuf)

{
  sqlite3_stmt *local_30;
  sqlite3_stmt *pReplace;
  Fts5Buffer *pFStack_20;
  int rc;
  Fts5Buffer *pBuf_local;
  i64 iRowid_local;
  Fts5Storage *p_local;
  
  pReplace._4_4_ = 0;
  if (p->pConfig->bColumnsize != 0) {
    local_30 = (sqlite3_stmt *)0x0;
    pFStack_20 = pBuf;
    pBuf_local = (Fts5Buffer *)iRowid;
    iRowid_local = (i64)p;
    pReplace._4_4_ = fts5StorageGetStmt(p,6,&local_30,(char **)0x0);
    if (pReplace._4_4_ == 0) {
      sqlite3_bind_int64(local_30,1,(sqlite_int64)pBuf_local);
      sqlite3_bind_blob(local_30,2,pFStack_20->p,pFStack_20->n,(_func_void_void_ptr *)0x0);
      sqlite3_step(local_30);
      pReplace._4_4_ = sqlite3_reset(local_30);
      sqlite3_bind_null(local_30,2);
    }
  }
  return pReplace._4_4_;
}

Assistant:

static int fts5StorageInsertDocsize(
  Fts5Storage *p,                 /* Storage module to write to */
  i64 iRowid,                     /* id value */
  Fts5Buffer *pBuf                /* sz value */
){
  int rc = SQLITE_OK;
  if( p->pConfig->bColumnsize ){
    sqlite3_stmt *pReplace = 0;
    rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_DOCSIZE, &pReplace, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pReplace, 1, iRowid);
      sqlite3_bind_blob(pReplace, 2, pBuf->p, pBuf->n, SQLITE_STATIC);
      sqlite3_step(pReplace);
      rc = sqlite3_reset(pReplace);
      sqlite3_bind_null(pReplace, 2);
    }
  }
  return rc;
}